

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathCoreRecursive.cpp
# Opt level: O2

void mathCore::do_simplification(expression *a)

{
  const_iterator cVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  iterator iVar5;
  undefined4 extraout_var;
  expression *src;
  expression *a_00;
  expression *dst;
  expression *a_01;
  expression *child;
  expression *local_28;
  
  a_00 = (expression *)&stack0xffffffffffffffd8;
  bVar3 = is_and(a);
  if (bVar3) {
    combine_and(a);
    cVar1._M_node = (a->contents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    a_01 = *(expression **)(cVar1._M_node + 1);
    local_28 = a_01;
    iVar5 = std::
            _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
            ::erase_abi_cxx11_((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                                *)&a->contents,cVar1);
    bVar3 = is_or(a_01);
  }
  else {
    bVar3 = is_or(a);
    if (!bVar3) {
      return;
    }
    combine_or(a);
    cVar1._M_node = (a->contents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    a_01 = *(expression **)(cVar1._M_node + 1);
    local_28 = a_01;
    iVar5 = std::
            _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
            ::erase_abi_cxx11_((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                                *)&a->contents,cVar1);
    bVar3 = is_and(a_01);
  }
  if (bVar3 == false) {
    return;
  }
  src = a_01;
  absorbtion_law(a,a_01);
  bVar3 = is_literal(a_01);
  if ((bVar3) || (bVar3 = is_var(a_01), bVar3)) goto LAB_00108fbd;
  uVar2 = (a->contents)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  dst = a;
  if (uVar2 < 2) {
    if (uVar2 == 1) {
      dst = *(expression **)(iVar5._M_node + 1);
      goto LAB_00108fa2;
    }
  }
  else {
LAB_00108fa2:
    iVar4 = copy((EVP_PKEY_CTX *)dst,(EVP_PKEY_CTX *)src);
    distributive_law(a,a_01,(expression *)CONCAT44(extraout_var,iVar4));
  }
  delete_children(a);
LAB_00108fbd:
  std::
  _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
  ::_M_insert_equal<expression*const&>
            ((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
              *)&a->contents,&stack0xffffffffffffffd8);
  empty_expression((mathCore *)a,a_00);
  return;
}

Assistant:

void mathCore::do_simplification(expression* a) {
	if (is_and(a)) {
		combine_and(a);

		auto iter = a->contents.begin();
		expression* child = *iter;
		iter = a->contents.erase(iter);	// Pop it!

		if (is_or(child)) {
			absorbtion_law(a, child);

			if (is_literal(child) || is_var(child)) {
				a->contents.insert(child); // Insert it back if its simple
			}
			else {
				// a is our original parent and where the answer needs to go, so we can't distribute it
				// we distribute a copy!
				if (a->contents.size() > 1) {
					distributive_law(a, child, mathCore::copy(a));
				}
				else if (a->contents.size() == 1) {
					distributive_law(a, child, mathCore::copy(*iter));	// Single variables distribute easily
				}

				delete_children(a);	// Remove everything from a
				a->contents.insert(child);	// Put in us!
			}
			empty_expression(a);
		}
	}
	else if (is_or(a)) {
		combine_or(a);

		auto iter = a->contents.begin();
		expression* child = *iter;
		iter = a->contents.erase(iter);	// Pop it!

		if (is_and(child)) {
			absorbtion_law(a, child);

			if (is_literal(child) || is_var(child)) {
				a->contents.insert(child); // Insert it back if its simple
			}
			else {
				// a is our original parent and where the answer needs to go, so we can't distribute it
				// we distribute a copy!
				if (a->contents.size() > 1) {
					distributive_law(a, child, mathCore::copy(a));
				}
				else if (a->contents.size() == 1) {
					distributive_law(a, child, mathCore::copy(*iter));	// Single variables distribute easily
				}

				
				delete_children(a);	// Remove everything from a
				a->contents.insert(child);
			}
			empty_expression(a);
		}
	}
}